

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O0

bool str::ends_with(string_view str,string_view content)

{
  char cVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  reference pcVar5;
  reverse_iterator<const_char_*> local_58;
  reverse_iterator<const_char_*> local_50;
  undefined1 local_48 [16];
  const_reverse_iterator content_it;
  const_reverse_iterator str_it;
  string_view content_local;
  string_view str_local;
  
  content_local._M_str = (char *)str._M_len;
  content_local._M_len = (size_t)content._M_str;
  str_it.current = (char *)content._M_len;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&content_local._M_str);
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&str_it);
  if (sVar3 < sVar4) {
    str_local._M_str._7_1_ = false;
  }
  else {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&content_local._M_str);
    if (bVar2) {
      str_local._M_str._7_1_ =
           std::basic_string_view<char,_std::char_traits<char>_>::empty
                     ((basic_string_view<char,_std::char_traits<char>_> *)&str_it);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::rbegin
                ((basic_string_view<char,_std::char_traits<char>_> *)&content_it);
      std::basic_string_view<char,_std::char_traits<char>_>::rbegin
                ((basic_string_view<char,_std::char_traits<char>_> *)(local_48 + 8));
      while( true ) {
        std::basic_string_view<char,_std::char_traits<char>_>::rend
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
        bVar2 = std::operator!=((reverse_iterator<const_char_*> *)(local_48 + 8),
                                (reverse_iterator<const_char_*> *)local_48);
        if (!bVar2) break;
        pcVar5 = Catch::clara::std::reverse_iterator<const_char_*>::operator*
                           ((reverse_iterator<const_char_*> *)&content_it);
        cVar1 = *pcVar5;
        pcVar5 = Catch::clara::std::reverse_iterator<const_char_*>::operator*
                           ((reverse_iterator<const_char_*> *)(local_48 + 8));
        if (cVar1 != *pcVar5) {
          return false;
        }
        std::reverse_iterator<const_char_*>::operator++(&local_50,(int)&content_it);
        std::reverse_iterator<const_char_*>::operator++(&local_58,(int)local_48 + 8);
      }
      str_local._M_str._7_1_ = true;
    }
  }
  return str_local._M_str._7_1_;
}

Assistant:

inline bool ends_with(std::string_view str, std::string_view content) {
        if (str.length() < content.length()) {
            return false;
        }

        if (str.empty()) {
            return content.empty();
        }

        for (auto str_it = str.rbegin(), content_it = content.rbegin(); content_it != content.rend(); str_it++, content_it++) {
            if (*str_it != *content_it) {
                return false;
            }
        }
        return true;
    }